

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImGuiWindow **ppIVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  bool bVar6;
  short sVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  ImGuiWindow *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiWindow *pIVar14;
  ImGuiWindow *pIVar15;
  float fVar16;
  ImGuiContext *g;
  byte bVar17;
  float fVar18;
  char cVar19;
  long lVar20;
  char cVar21;
  int iVar22;
  ImGuiWindow *pIVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  
  pIVar13 = GImGui;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = (GImGui->Style).TouchExtraPadding.x;
  auVar25._4_4_ = (GImGui->Style).TouchExtraPadding.y;
  auVar25 = maxps(auVar25,_DAT_0017a380);
  GImGui->WindowsHoverPadding = auVar25._0_8_;
  pIVar14 = pIVar13->MovingWindow;
  pIVar23 = (ImGuiWindow *)0x0;
  if ((pIVar14 != (ImGuiWindow *)0x0) && ((pIVar14->Flags & 0x200) == 0)) {
    pIVar23 = pIVar14;
  }
  fVar8 = (pIVar13->Style).TouchExtraPadding.x;
  bVar24 = (pIVar13->IO).ConfigWindowsResizeFromEdges;
  fVar16 = fVar8;
  if (bVar24 == true) {
    fVar16 = (pIVar13->WindowsHoverPadding).x;
  }
  fVar9 = (pIVar13->Style).TouchExtraPadding.y;
  fVar18 = fVar9;
  if (bVar24 != false) {
    fVar18 = (pIVar13->WindowsHoverPadding).y;
  }
  lVar20 = (long)(pIVar13->Windows).Size;
  if (lVar20 < 1) {
    pIVar15 = (ImGuiWindow *)0x0;
  }
  else {
    lVar20 = lVar20 + 1;
    pIVar15 = (ImGuiWindow *)0x0;
    do {
      pIVar12 = (pIVar13->Windows).Data[lVar20 + -2];
      bVar24 = false;
      if (((pIVar12->Active == true) && (pIVar12->Hidden == false)) &&
         (uVar10 = pIVar12->Flags, (uVar10 >> 9 & 1) == 0)) {
        fVar26 = fVar8;
        if ((uVar10 & 0x1000042) == 0) {
          fVar26 = fVar16;
        }
        fVar3 = (pIVar13->IO).MousePos.x;
        if ((pIVar12->OuterRectClipped).Min.x - fVar26 <= fVar3) {
          fVar27 = fVar9;
          if ((uVar10 & 0x1000042) == 0) {
            fVar27 = fVar18;
          }
          fVar4 = (pIVar13->IO).MousePos.y;
          if ((((pIVar12->OuterRectClipped).Min.y - fVar27 <= fVar4) &&
              (fVar3 < fVar26 + (pIVar12->OuterRectClipped).Max.x)) &&
             (fVar4 < fVar27 + (pIVar12->OuterRectClipped).Max.y)) {
            sVar7 = (pIVar12->HitTestHoleSize).x;
            if (sVar7 != 0) {
              fVar26 = (float)(int)(pIVar12->HitTestHoleOffset).x + (pIVar12->Pos).x;
              if (fVar26 <= fVar3) {
                fVar27 = (float)(int)(pIVar12->HitTestHoleOffset).y + (pIVar12->Pos).y;
                bVar24 = (fVar4 < (float)(int)(pIVar12->HitTestHoleSize).y + fVar27 &&
                         fVar3 < fVar26 + (float)(int)sVar7) && fVar27 <= fVar4;
              }
              else {
                bVar24 = false;
              }
              if (bVar24) {
                bVar24 = false;
                goto LAB_0010f008;
              }
            }
            if (pIVar23 == (ImGuiWindow *)0x0) {
              pIVar23 = pIVar12;
            }
            if (((pIVar15 == (ImGuiWindow *)0x0) &&
                (pIVar15 = pIVar12, pIVar14 != (ImGuiWindow *)0x0)) &&
               (pIVar12->RootWindow == pIVar14->RootWindow)) {
              pIVar15 = (ImGuiWindow *)0x0;
            }
            bVar24 = pIVar15 != (ImGuiWindow *)0x0 && pIVar23 != (ImGuiWindow *)0x0;
          }
        }
      }
LAB_0010f008:
    } while ((!bVar24) && (lVar20 = lVar20 + -1, 1 < lVar20));
  }
  pIVar13->HoveredWindow = pIVar23;
  pIVar13->HoveredWindowUnderMovingWindow = pIVar15;
  pIVar14 = GetTopMostPopupModal();
  bVar24 = false;
  if ((pIVar14 != (ImGuiWindow *)0x0) && (bVar24 = false, pIVar23 != (ImGuiWindow *)0x0)) {
    pIVar15 = pIVar23->RootWindow;
    if (pIVar15->RootWindow == pIVar14) {
      bVar24 = false;
    }
    else if (pIVar15 == (ImGuiWindow *)0x0) {
      bVar24 = true;
    }
    else {
      do {
        bVar24 = pIVar15 == pIVar14;
        if (bVar24) goto LAB_0010f06d;
        pIVar15 = pIVar15->ParentWindowInBeginStack;
      } while (pIVar15 != (ImGuiWindow *)0x0);
      bVar24 = false;
LAB_0010f06d:
      bVar24 = (bool)(bVar24 ^ 1);
    }
  }
  ppIVar1 = &pIVar13->HoveredWindow;
  uVar10 = (pIVar13->IO).ConfigFlags;
  iVar11 = (pIVar13->OpenPopupStack).Size;
  iVar22 = -1;
  lVar20 = 0;
  bVar17 = 0;
  do {
    if ((pIVar13->IO).MouseClicked[lVar20] == true) {
      (pIVar13->IO).MouseDownOwned[lVar20] = pIVar23 != (ImGuiWindow *)0x0 || 0 < iVar11;
      (pIVar13->IO).MouseDownOwnedUnlessPopupClose[lVar20] =
           pIVar23 != (ImGuiWindow *)0x0 || pIVar14 != (ImGuiWindow *)0x0;
    }
    bVar6 = (pIVar13->IO).MouseDown[lVar20];
    if ((bVar6 == true) &&
       ((iVar22 == -1 ||
        (dVar5 = (pIVar13->IO).MouseClickedTime[iVar22],
        pdVar2 = (pIVar13->IO).MouseClickedTime + lVar20, *pdVar2 <= dVar5 && dVar5 != *pdVar2)))) {
      iVar22 = (int)lVar20;
    }
    bVar17 = bVar17 & 1 | bVar6;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 5);
  bVar6 = true;
  if ((uVar10 & 0x10) == 0) {
    bVar6 = bVar24;
  }
  cVar19 = '\x01';
  cVar21 = '\x01';
  if (iVar22 != -1) {
    cVar21 = (pIVar13->IO).MouseDownOwned[iVar22];
    cVar19 = (pIVar13->IO).MouseDownOwnedUnlessPopupClose[iVar22];
  }
  bVar24 = true;
  if ((pIVar13->DragDropActive == true) &&
     (bVar24 = true, (pIVar13->DragDropSourceFlags & 0x10) != 0)) {
    bVar24 = bVar6;
  }
  if (cVar21 != '\0') {
    bVar24 = bVar6;
  }
  if (bVar24) {
    *ppIVar1 = (ImGuiWindow *)0x0;
    pIVar13->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  iVar22 = pIVar13->WantCaptureMouseNextFrame;
  if (iVar22 == -1) {
    if ((cVar21 == '\0') || ((bVar24 = true, *ppIVar1 == (ImGuiWindow *)0x0 && (bVar17 == 0)))) {
      bVar24 = 0 < iVar11;
    }
    (pIVar13->IO).WantCaptureMouse = bVar24;
    if ((cVar19 == '\0') || ((bVar24 = true, *ppIVar1 == (ImGuiWindow *)0x0 && (bVar17 == 0)))) {
      bVar24 = pIVar14 != (ImGuiWindow *)0x0;
    }
    (pIVar13->IO).WantCaptureMouseUnlessPopupClose = bVar24;
  }
  else {
    (pIVar13->IO).WantCaptureMouseUnlessPopupClose = iVar22 != 0;
    (pIVar13->IO).WantCaptureMouse = iVar22 != 0;
  }
  if (pIVar13->WantCaptureKeyboardNextFrame == -1) {
    bVar24 = pIVar13->ActiveId != 0 || pIVar14 != (ImGuiWindow *)0x0;
  }
  else {
    bVar24 = pIVar13->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar13->IO).WantCaptureKeyboard = bVar24;
  if (((uVar10 & 9) == 1 & (pIVar13->IO).NavActive) == 1) {
    (pIVar13->IO).WantCaptureKeyboard = true;
  }
  (pIVar13->IO).WantTextInput = pIVar13->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}